

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O1

void aom_dc_predictor_16x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  int iVar1;
  undefined1 uVar2;
  undefined4 uVar3;
  undefined1 uVar5;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)left;
  auVar4 = psadbw(auVar4,(undefined1  [16])0x0);
  auVar6 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])above);
  iVar1 = (CONCAT22(auVar6._2_2_ + auVar4._2_2_ + auVar6._10_2_,
                    auVar6._0_2_ + auVar4._0_2_ + auVar6._8_2_) + 0xcU >> 3) * 0x5556;
  uVar5 = (undefined1)((uint)iVar1 >> 0x18);
  uVar2 = (undefined1)((uint)iVar1 >> 0x10);
  auVar4 = ZEXT416(CONCAT22(CONCAT11(uVar5,uVar5),CONCAT11(uVar2,uVar2)));
  auVar4 = pshuflw(auVar4,auVar4,0);
  uVar3 = auVar4._0_4_;
  iVar1 = 8;
  do {
    *(undefined4 *)dst = uVar3;
    *(undefined4 *)(dst + 4) = uVar3;
    *(undefined4 *)(dst + 8) = uVar3;
    *(undefined4 *)(dst + 0xc) = uVar3;
    dst = dst + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_dc_predictor_16x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                const uint8_t *above, const uint8_t *left) {
  const __m128i sum_left = dc_sum_8(left);
  __m128i sum_above = dc_sum_16_sse2(above);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 12;
  sum = divide_using_multiply_shift(sum, 3, DC_MULTIPLIER_1X2);
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_16xh(&row, 8, dst, stride);
}